

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_OriginalOrder_Test::TestBody(TApp_OriginalOrder_Test *this)

{
  App *this_00;
  bool bVar1;
  Option *pOVar2;
  char *message;
  Option *pOVar3;
  long lVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<CLI::Option_*> __l_01;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> st2;
  vector<int,_std::allocator<int>_> st1;
  allocator_type local_201;
  AssertHelper local_200;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> local_1f0;
  vector<int,_std::allocator<int>_> local_1d8;
  vector<int,_std::allocator<int>_> local_1b8;
  Option *local_198;
  vector<int,_std::allocator<int>_> local_190;
  Option *local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-a","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  pOVar2 = CLI::App::add_option<int>(this_00,&local_50,&local_1b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-b","");
  pOVar3 = (Option *)0x178ffc;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  local_198 = CLI::App::add_option<int>(this_00,&local_90,&local_1d8,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"-a","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"1","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"-b","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"2","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"-a3","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"-a","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_190,&local_b0);
  lVar4 = 0;
  do {
    if (local_c0 + lVar4 != *(undefined1 **)((long)local_d0 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_d0 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0xe0);
  TApp::run(&this->super_TApp);
  local_200.data_ = (AssertHelperData *)0x300000001;
  local_1f8.ptr_._0_4_ = 4;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_200;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_190,__l,&local_201);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&local_1f0,"st1","std::vector<int>({1, 3, 4})",&local_1b8,&local_190);
  if ((pointer *)
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pOVar3 = *local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d3,(char *)pOVar3);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((pointer *)
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_200.data_._0_4_ = 2;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_200;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_190,__l_00,&local_201);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)&local_1f0,"st2","std::vector<int>({2})",&local_1d8,&local_190);
  if ((pointer *)
      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer *)0x0) {
    operator_delete(local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pOVar3 = (Option *)0x178ffc;
    }
    else {
      pOVar3 = *local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d4,(char *)pOVar3);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((pointer *)
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((pointer *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 2))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)local_198;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_190;
  local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)pOVar2;
  local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pOVar2;
  local_178 = pOVar2;
  CLI::std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector
            (&local_1f0,__l_01,(allocator_type *)&local_201);
  testing::internal::
  CmpHelperEQ<std::vector<CLI::Option*,std::allocator<CLI::Option*>>,std::vector<CLI::Option*,std::allocator<CLI::Option*>>>
            ((internal *)&local_200,"app.parse_order()",
             "std::vector<CLI::Option *>({op1, op2, op1, op1})",&(this->super_TApp).app.parse_order_
             ,&local_1f0);
  if ((void *)CONCAT71(local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_1f0.super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1f0.
                                     super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_1f0.
                                     super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_200.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if ((undefined8 *)CONCAT44(local_1f8.ptr_._4_4_,local_1f8.ptr_._0_4_) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT44(local_1f8.ptr_._4_4_,local_1f8.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d6,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if ((Option *)
        local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (Option *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((Option *)
          local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (Option *)0x0)) {
        (**(code **)((((OptionBase<CLI::Option> *)
                      local_190.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)->group_)._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(TApp, OriginalOrder) {
    std::vector<int> st1;
    CLI::Option *op1 = app.add_option("-a", st1);
    std::vector<int> st2;
    CLI::Option *op2 = app.add_option("-b", st2);

    args = {"-a", "1", "-b", "2", "-a3", "-a", "4"};

    run();

    EXPECT_EQ(st1, std::vector<int>({1, 3, 4}));
    EXPECT_EQ(st2, std::vector<int>({2}));

    EXPECT_EQ(app.parse_order(), std::vector<CLI::Option *>({op1, op2, op1, op1}));
}